

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
iterator(iterator *this,
        olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *tree)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  
  this->db_ = tree;
  std::
  stack<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>>
  ::
  stack<std::deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>,void>
            (&this->stack_);
  auVar1 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0xe0) = ZEXT1632(auVar1);
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0xc0) = ZEXT1632(auVar1);
  auVar2 = ZEXT1632(auVar1);
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0xa0) = auVar2;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0x80) = auVar2;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0x60) = auVar2;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0x40) = auVar2;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0x20) = ZEXT1632(auVar1);
  *(undefined1 (*) [32])(this->keybuf_).ibuf = ZEXT1632(auVar1);
  (this->keybuf_).buf = (this->keybuf_).ibuf;
  (this->keybuf_).cap = 0x100;
  (this->keybuf_).off = 0;
  return;
}

Assistant:

explicit iterator(olc_db& tree) noexcept : db_(tree) {}